

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_delete *m)

{
  bool bVar1;
  pointer ppVar2;
  uint64_t timestamp;
  function<void_(const_helix::event_&)> *this_00;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  order_book *ob;
  iterator it;
  uint64_t order_id;
  unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
  *in_stack_ffffffffffffff58;
  order_book *this_01;
  order_book *ob_00;
  undefined1 local_70 [64];
  order_book *local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_20;
  char *local_18;
  
  local_18 = (char *)itch_uatoi((char *)(in_RSI + 1),9);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x14b048);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x14b091);
    local_30 = ppVar2->second;
    order_book::remove(local_30,local_18);
    this_01 = local_30;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    order_book::set_timestamp(this_01,timestamp);
    ob_00 = (order_book *)&in_RDI->_process_event;
    this_00 = (function<void_(const_helix::event_&)> *)order_book::symbol_abi_cxx11_(local_30);
    nordic_itch_handler::timestamp(in_RDI);
    make_ob_event((string *)in_RDI,(uint64_t)local_70,ob_00,(event_mask)((ulong)this_00 >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()(this_00,(event *)this_01);
    event::~event((event *)0x14b12c);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_delete* m)
{
    uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
    auto it = order_id_map.find(order_id);
    if (it != order_id_map.end()) {
        auto& ob = it->second;
        ob.remove(order_id);
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}